

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509name.cc
# Opt level: O2

int X509_NAME_get_text_by_OBJ(X509_NAME *name,ASN1_OBJECT *obj,char *buf,int len)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  X509_NAME_ENTRY *pXVar4;
  uint uVar5;
  ASN1_STRING *in;
  ulong len_00;
  uchar *text;
  CBS cbs;
  
  uVar5 = 0xffffffff;
  iVar2 = X509_NAME_get_index_by_OBJ(name,obj,-1);
  if (-1 < iVar2) {
    pXVar4 = X509_NAME_get_entry(name,iVar2);
    if (pXVar4 == (X509_NAME_ENTRY *)0x0) {
      in = (ASN1_STRING *)0x0;
    }
    else {
      in = pXVar4->value;
    }
    text = (uchar *)0x0;
    uVar3 = ASN1_STRING_to_UTF8(&text,in);
    uVar1 = 0xffffffff;
    uVar5 = uVar1;
    if (-1 < (int)uVar3) {
      len_00 = (ulong)uVar3;
      cbs.data = text;
      cbs.len = len_00;
      iVar2 = CBS_contains_zero_byte(&cbs);
      if ((((iVar2 == 0) && (uVar5 = uVar3, buf != (char *)0x0)) &&
          (uVar5 = uVar1, (int)uVar3 < len)) &&
         (iVar2 = CBS_copy_bytes(&cbs,(uint8_t *)buf,len_00), iVar2 != 0)) {
        buf[len_00] = '\0';
        uVar5 = uVar3;
      }
    }
    OPENSSL_free(text);
  }
  return uVar5;
}

Assistant:

int X509_NAME_get_text_by_OBJ(const X509_NAME *name, const ASN1_OBJECT *obj,
                              char *buf, int len) {
  int i = X509_NAME_get_index_by_OBJ(name, obj, -1);
  if (i < 0) {
    return -1;
  }
  const ASN1_STRING *data =
      X509_NAME_ENTRY_get_data(X509_NAME_get_entry(name, i));
  unsigned char *text = NULL;
  int ret = -1;
  int text_len = ASN1_STRING_to_UTF8(&text, data);
  // Fail if we could not encode as UTF-8.
  if (text_len < 0) {
    goto out;
  }
  CBS cbs;
  CBS_init(&cbs, text, text_len);
  // Fail if the UTF-8 encoding constains a 0 byte because this is
  // returned as a C string and callers very often do not check.
  if (CBS_contains_zero_byte(&cbs)) {
    goto out;
  }
  // We still support the "pass NULL to find out how much" API
  if (buf != NULL) {
    if (text_len >= len || len <= 0 ||
        !CBS_copy_bytes(&cbs, (uint8_t *)buf, text_len)) {
      goto out;
    }
    // It must be a C string
    buf[text_len] = '\0';
  }
  ret = text_len;

out:
  OPENSSL_free(text);
  return ret;
}